

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_detector.cc
# Opt level: O0

void __thiscall
webrtc::TransientDetector::TransientDetector(TransientDetector *this,int sample_rate_hz)

{
  unique_ptr<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  WPDTree *this_01;
  MovingMoments *this_02;
  ulong uVar3;
  float *pfVar4;
  bool bVar5;
  unique_ptr<webrtc::MovingMoments,std::default_delete<webrtc::MovingMoments>> *local_40;
  value_type local_38;
  int local_34;
  ulong uStack_30;
  int i_1;
  size_t i;
  int samples_per_transient;
  int local_14;
  TransientDetector *pTStack_10;
  int sample_rate_hz_local;
  TransientDetector *this_local;
  
  this->samples_per_chunk_ = (long)((sample_rate_hz * 10) / 1000);
  local_14 = sample_rate_hz;
  pTStack_10 = this;
  std::unique_ptr<webrtc::WPDTree,std::default_delete<webrtc::WPDTree>>::
  unique_ptr<std::default_delete<webrtc::WPDTree>,void>
            ((unique_ptr<webrtc::WPDTree,std::default_delete<webrtc::WPDTree>> *)&this->wpd_tree_);
  local_40 = (unique_ptr<webrtc::MovingMoments,std::default_delete<webrtc::MovingMoments>> *)
             this->moving_moments_;
  do {
    std::unique_ptr<webrtc::MovingMoments,std::default_delete<webrtc::MovingMoments>>::
    unique_ptr<std::default_delete<webrtc::MovingMoments>,void>(local_40);
    local_40 = local_40 + 8;
  } while (local_40 !=
           (unique_ptr<webrtc::MovingMoments,std::default_delete<webrtc::MovingMoments>> *)
           &this->first_moments_);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<std::default_delete<float[]>,void>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->first_moments_);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<std::default_delete<float[]>,void>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->second_moments_);
  this->last_first_moment_[4] = 0.0;
  this->last_first_moment_[5] = 0.0;
  this->last_first_moment_[6] = 0.0;
  this->last_first_moment_[7] = 0.0;
  this->last_first_moment_[0] = 0.0;
  this->last_first_moment_[1] = 0.0;
  this->last_first_moment_[2] = 0.0;
  this->last_first_moment_[3] = 0.0;
  this->last_second_moment_[4] = 0.0;
  this->last_second_moment_[5] = 0.0;
  this->last_second_moment_[6] = 0.0;
  this->last_second_moment_[7] = 0.0;
  this->last_second_moment_[0] = 0.0;
  this->last_second_moment_[1] = 0.0;
  this->last_second_moment_[2] = 0.0;
  this->last_second_moment_[3] = 0.0;
  std::deque<float,_std::allocator<float>_>::deque(&this->previous_results_);
  this->chunks_at_startup_left_to_delete_ = 3;
  this->reference_energy_ = 1.0;
  this->using_reference_ = false;
  bVar5 = true;
  if (((local_14 != 8000) && (bVar5 = true, local_14 != 16000)) && (bVar5 = true, local_14 != 32000)
     ) {
    bVar5 = local_14 == 48000;
  }
  if (!bVar5) {
    __assert_fail("sample_rate_hz == ts::kSampleRate8kHz || sample_rate_hz == ts::kSampleRate16kHz || sample_rate_hz == ts::kSampleRate32kHz || sample_rate_hz == ts::kSampleRate48kHz"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_detector.cc"
                  ,0x2a,"webrtc::TransientDetector::TransientDetector(int)");
  }
  *(byte *)&this->samples_per_chunk_ = (byte)this->samples_per_chunk_ & 0xf8;
  i._0_4_ = (local_14 * 0x1e) / 1000 & 0xfffffff8;
  this->tree_leaves_data_length_ = this->samples_per_chunk_ >> 3;
  this_01 = (WPDTree *)operator_new(0x18);
  WPDTree::WPDTree(this_01,this->samples_per_chunk_,(float *)kDaubechies8HighPassCoefficients,
                   (float *)kDaubechies8LowPassCoefficients,0x10,3);
  std::unique_ptr<webrtc::WPDTree,_std::default_delete<webrtc::WPDTree>_>::reset
            (&this->wpd_tree_,this_01);
  for (uStack_30 = 0; uStack_30 < 8; uStack_30 = uStack_30 + 1) {
    this_00 = this->moving_moments_ + uStack_30;
    this_02 = (MovingMoments *)operator_new(0x60);
    MovingMoments::MovingMoments(this_02,(ulong)(long)(int)(uint)i >> 3);
    std::unique_ptr<webrtc::MovingMoments,_std::default_delete<webrtc::MovingMoments>_>::reset
              (this_00,this_02);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->tree_leaves_data_length_;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pfVar4 = (float *)operator_new__(uVar3);
  std::unique_ptr<float[],std::default_delete<float[]>>::reset<float*,void>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->first_moments_,pfVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->tree_leaves_data_length_;
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pfVar4 = (float *)operator_new__(uVar3);
  std::unique_ptr<float[],std::default_delete<float[]>>::reset<float*,void>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->second_moments_,pfVar4);
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    local_38 = 0.0;
    std::deque<float,_std::allocator<float>_>::push_back(&this->previous_results_,&local_38);
  }
  return;
}

Assistant:

TransientDetector::TransientDetector(int sample_rate_hz)
    : samples_per_chunk_(sample_rate_hz * ts::kChunkSizeMs / 1000),
      last_first_moment_(),
      last_second_moment_(),
      chunks_at_startup_left_to_delete_(kChunksAtStartupLeftToDelete),
      reference_energy_(1.f),
      using_reference_(false) {
  assert(sample_rate_hz == ts::kSampleRate8kHz ||
         sample_rate_hz == ts::kSampleRate16kHz ||
         sample_rate_hz == ts::kSampleRate32kHz ||
         sample_rate_hz == ts::kSampleRate48kHz);
  int samples_per_transient = sample_rate_hz * kTransientLengthMs / 1000;
  // Adjustment to avoid data loss while downsampling, making
  // |samples_per_chunk_| and |samples_per_transient| always divisible by
  // |kLeaves|.
  samples_per_chunk_ -= samples_per_chunk_ % kLeaves;
  samples_per_transient -= samples_per_transient % kLeaves;

  tree_leaves_data_length_ = samples_per_chunk_ / kLeaves;
  wpd_tree_.reset(new WPDTree(samples_per_chunk_,
                              kDaubechies8HighPassCoefficients,
                              kDaubechies8LowPassCoefficients,
                              kDaubechies8CoefficientsLength,
                              kLevels));
  for (size_t i = 0; i < kLeaves; ++i) {
    moving_moments_[i].reset(
        new MovingMoments(samples_per_transient / kLeaves));
  }

  first_moments_.reset(new float[tree_leaves_data_length_]);
  second_moments_.reset(new float[tree_leaves_data_length_]);

  for (int i = 0; i < kChunksAtStartupLeftToDelete; ++i) {
    previous_results_.push_back(0.f);
  }
}